

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::createBuffers
          (MultipleBindingCase *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  float *pfVar12;
  pointer pVVar13;
  int y;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  float *pfVar18;
  pointer pVVar19;
  int x;
  long lVar20;
  Vec4 *color;
  undefined8 *puVar21;
  long lVar22;
  size_type __n;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> primitiveData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  Vec4 green;
  Vec4 yellow;
  allocator_type local_69;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_68;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long lVar11;
  
  iVar9 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  local_38 = 0x3f80000000000000;
  uStack_30 = 0x3f80000000000000;
  local_28 = 0x3f8000003f800000;
  uStack_20 = 0x3f80000000000000;
  bVar3 = (this->m_spec).instanced;
  uVar16 = 0x12c0;
  if (bVar3 != false) {
    uVar16 = 800;
  }
  uVar15 = 2;
  if ((this->m_spec).zeroStride == false) {
    uVar15 = (ulong)uVar16;
  }
  bVar4 = (this->m_spec).aliasingBuffers;
  uVar17 = 0;
  if (bVar4 != false) {
    uVar17 = uVar15;
  }
  uVar16 = (int)uVar17 + 0x960;
  if (bVar3 != false) {
    uVar16 = (int)uVar17 + 6;
  }
  __n = 0;
  if (bVar4 == false) {
    __n = uVar15;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_68,(ulong)uVar16,(allocator_type *)&local_50);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_50,__n,&local_69);
  pVVar13 = local_50.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_spec).aliasingBuffers == true) {
    if ((this->m_spec).instanced == true) {
      pVVar13 = local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + 6;
    }
    else {
      pVVar13 = local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x960;
    }
  }
  if ((this->m_spec).instanced == false) {
    lVar14 = 0;
    lVar20 = 0;
    do {
      fVar23 = (float)(int)lVar20 / 20.0;
      fVar23 = fVar23 + fVar23 + -1.0;
      lVar20 = lVar20 + 1;
      fVar24 = (float)(int)lVar20 / 20.0;
      fVar24 = fVar24 + fVar24 + -1.0;
      iVar9 = 0;
      lVar22 = 0;
      do {
        fVar25 = (float)iVar9 / 20.0 + (float)iVar9 / 20.0 + -1.0;
        *(float *)((long)(local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22 + lVar14) =
             fVar25;
        *(float *)((long)(local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22 + 4 + lVar14)
             = fVar23;
        *(undefined8 *)
         ((long)(local_68.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar22 + 8 + lVar14) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar14 + lVar22) =
             fVar25;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar22 + lVar14 + 4)
             = fVar24;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar22 + lVar14 + 8) =
             0x3f80000000000000;
        iVar9 = iVar9 + 1;
        fVar26 = (float)iVar9 / 20.0 + (float)iVar9 / 20.0 + -1.0;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar14 + lVar22) =
             fVar26;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar22 + lVar14 + 4)
             = fVar24;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[2].m_data + lVar22 + lVar14 + 8) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar14 + lVar22) =
             fVar25;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar22 + lVar14 + 4)
             = fVar23;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[3].m_data + lVar22 + lVar14 + 8) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar14 + lVar22) =
             fVar26;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar22 + lVar14 + 4)
             = fVar24;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[4].m_data + lVar22 + lVar14 + 8) =
             0x3f80000000000000;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar14 + lVar22) =
             fVar26;
        *(float *)((long)local_68.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar22 + lVar14 + 4)
             = fVar23;
        *(undefined8 *)
         ((long)local_68.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[5].m_data + lVar22 + lVar14 + 8) =
             0x3f80000000000000;
        lVar22 = lVar22 + 0x60;
      } while (lVar22 != 0x780);
      lVar14 = lVar14 + 0x780;
    } while (lVar20 != 0x14);
  }
  else {
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[0] = 0.0;
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[1] = 0.0;
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
    (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
     _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = 0.1;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
    local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
  }
  if ((this->m_spec).zeroStride == true) {
    *(undefined8 *)pVVar13->m_data = local_38;
    *(undefined8 *)(pVVar13->m_data + 2) = uStack_30;
    pVVar13[1].m_data[0] = 0.0;
    pVVar13[1].m_data[1] = 0.0;
    pVVar13[1].m_data[2] = 0.0;
    pVVar13[1].m_data[3] = 0.0;
  }
  else if ((this->m_spec).instanced == false) {
    lVar14 = 0;
    do {
      lVar20 = 0;
      pVVar19 = pVVar13;
      do {
        puVar21 = &local_28;
        if (((int)lVar20 + (int)lVar14 & 1U) == 0) {
          puVar21 = &local_38;
        }
        lVar22 = 0x10;
        do {
          uVar5 = *(undefined4 *)((long)puVar21 + 4);
          uVar6 = *(undefined4 *)(puVar21 + 1);
          uVar7 = *(undefined4 *)((long)puVar21 + 0xc);
          puVar2 = (undefined4 *)((long)pVVar19[-1].m_data + lVar22);
          *puVar2 = *(undefined4 *)puVar21;
          puVar2[1] = uVar5;
          puVar2[2] = uVar6;
          puVar2[3] = uVar7;
          puVar1 = (undefined8 *)((long)pVVar19->m_data + lVar22);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar22 = lVar22 + 0x20;
        } while (lVar22 != 0xd0);
        lVar20 = lVar20 + 1;
        pVVar19 = pVVar19 + 0xc;
      } while (lVar20 != 0x14);
      lVar14 = lVar14 + 1;
      pVVar13 = pVVar13 + 0xf0;
    } while (lVar14 != 0x14);
  }
  else {
    pfVar12 = pVVar13[1].m_data + 3;
    lVar14 = 0;
    do {
      fVar23 = (float)(int)lVar14 / 20.0;
      lVar20 = 0;
      pfVar18 = pfVar12;
      do {
        puVar21 = &local_28;
        if (((int)lVar14 + (int)lVar20 & 1U) == 0) {
          puVar21 = &local_38;
        }
        uVar8 = puVar21[1];
        *(undefined8 *)(pfVar18 + -7) = *puVar21;
        *(undefined8 *)(pfVar18 + -5) = uVar8;
        fVar24 = (float)(int)lVar20 / 20.0;
        ((Vector<float,_4> *)(pfVar18 + -3))->m_data[0] = fVar24 + fVar24 + -1.0;
        pfVar18[-2] = fVar23 + fVar23 + -1.0;
        pfVar18[-1] = 0.0;
        pfVar18[0] = 0.0;
        lVar20 = lVar20 + 1;
        pfVar18 = pfVar18 + 8;
      } while (lVar20 != 0x14);
      lVar14 = lVar14 + 1;
      pfVar12 = pfVar12 + 0xa0;
    } while (lVar14 != 0x14);
  }
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_primitiveBuf);
  (**(code **)(lVar11 + 0x40))(0x8892,this->m_primitiveBuf);
  (**(code **)(lVar11 + 0x150))
            (0x8892,(long)((int)local_68.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_68.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_68.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar10 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar10,"upload data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x31c);
  if ((this->m_spec).aliasingBuffers == false) {
    (**(code **)(lVar11 + 0x6c8))(1,&this->m_colorOffsetBuf);
    (**(code **)(lVar11 + 0x40))(0x8892,this->m_colorOffsetBuf);
    (**(code **)(lVar11 + 0x150))
              (0x8892,(long)((int)local_50.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)local_50.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
               local_50.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    dVar10 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar10,"upload colordata",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x325);
  }
  if (local_50.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MultipleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green				= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow				= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	const int				vertexDataSize		= (m_spec.instanced) ? (6) : (6 * GRID_SIZE * GRID_SIZE);
	const int				offsetColorSize		= (m_spec.zeroStride) ? (2) : (m_spec.instanced) ? (2 * GRID_SIZE * GRID_SIZE) : (2 * 6 * GRID_SIZE * GRID_SIZE);
	const int				primitiveBufSize	= (m_spec.aliasingBuffers) ? (vertexDataSize + offsetColorSize) : (vertexDataSize);
	const int				colorOffsetBufSize	= (m_spec.aliasingBuffers) ? (0) : (offsetColorSize);

	std::vector<tcu::Vec4>	primitiveData		(primitiveBufSize);
	std::vector<tcu::Vec4>	colorOffsetData		(colorOffsetBufSize);
	tcu::Vec4*				colorOffsetWritePtr = DE_NULL;

	if (m_spec.aliasingBuffers)
	{
		if (m_spec.instanced)
			colorOffsetWritePtr = &primitiveData[6];
		else
			colorOffsetWritePtr = &primitiveData[GRID_SIZE*GRID_SIZE*6];
	}
	else
		colorOffsetWritePtr = &colorOffsetData[0];

	// write vertex position

	if (m_spec.instanced)
	{
		// store single basic primitive
		primitiveData[0] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[1] = tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[2] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[3] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[4] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[5] = tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}
	else
	{
		// store whole grid
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			primitiveData[(y * GRID_SIZE + x) * 6 + 0] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 1] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 2] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 3] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 4] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 5] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
		}
	}

	// store color&offset

	if (m_spec.zeroStride)
	{
		colorOffsetWritePtr[0] = green;
		colorOffsetWritePtr[1] = tcu::Vec4(0.0f);
	}
	else if (m_spec.instanced)
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 0] = color;
			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}
	else
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		for (int v = 0; v < 6; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 0] = color;
			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 1] = tcu::Vec4(0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_primitiveBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_primitiveBuf);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(primitiveData.size() * sizeof(tcu::Vec4)), primitiveData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload data");

	if (!m_spec.aliasingBuffers)
	{
		// upload color & offset data

		gl.genBuffers(1, &m_colorOffsetBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "upload colordata");
	}
}